

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  curl_proxytype cVar1;
  ssl_connect_state sVar2;
  curl_blob *pcVar3;
  Curl_easy *pCVar4;
  ulong uVar5;
  byte bVar6;
  _Bool _Var7;
  CURLcode CVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  timediff_t tVar15;
  long lVar16;
  uint *puVar17;
  char *pcVar18;
  SSL_CIPHER *c;
  char *pcVar19;
  ulong uVar20;
  X509_CINF *n;
  ssl_backend_data *psVar21;
  int *piVar22;
  SSL_METHOD *meth;
  SSL_CTX *pSVar23;
  BIO_METHOD *pBVar24;
  BIO *pBVar25;
  stack_st_X509 *psVar26;
  X509 *pXVar27;
  X509_NAME *pXVar28;
  size_t sVar29;
  undefined8 uVar30;
  ASN1_INTEGER *pAVar31;
  X509_PUBKEY *pXVar32;
  X509_EXTENSION *ex;
  BIO *pBVar33;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar34;
  EVP_PKEY *pkey;
  X509 *pXVar35;
  ssl_backend_data *__s;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  void *pvVar36;
  size_t sVar37;
  OCSP_RESPONSE *resp;
  uchar *puVar38;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar39;
  EVP_MD *dgst;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *ssl;
  undefined7 in_register_00000009;
  long lVar40;
  undefined7 uVar41;
  curl_socket_t writefd;
  long lVar42;
  size_t size;
  size_t size_00;
  ulong larg;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  byte bVar43;
  bool bVar44;
  CURLcode CVar45;
  long lVar46;
  curl_socket_t readfd0;
  long lVar47;
  long lVar48;
  BIGNUM *bn;
  ASN1_OBJECT *bn_00;
  long lVar49;
  ulong unaff_R12;
  long lVar50;
  uint uVar51;
  char cVar52;
  bool bVar53;
  bool bVar54;
  ssl_backend_data *local_9f8;
  char *ptr;
  X509 *local_9e0;
  ssl_backend_data *local_9d8;
  BIO *local_9d0;
  X509 *local_9c8;
  BIO *local_9c0;
  X509 *local_9b8;
  ssl_backend_data *local_9b0;
  X509 *local_9a8;
  void *ssl_sessionid;
  ASN1_OBJECT *pubkeyoid;
  X509_ALGOR *sigalg;
  char *local_980;
  int cert_status;
  char *local_970;
  int crl_reason;
  ASN1_BIT_STRING *psig;
  curl_socket_t local_954;
  long local_950;
  _Bool *local_948;
  char *local_940;
  in6_addr addr;
  char error_buffer [256];
  
  local_9e0 = (X509 *)CONCAT44(local_9e0._4_4_,(int)CONCAT71(in_register_00000009,nonblocking));
  lVar14 = (long)sockindex;
  if (conn->ssl[lVar14].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_9c8 = (X509 *)CONCAT44(local_9c8._4_4_,conn->sock[lVar14]);
  local_950 = lVar14;
  local_948 = done;
  if (conn->ssl[lVar14].connecting_state == ssl_connect_1) {
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) {
      bVar53 = false;
      Curl_failf(data,"SSL connection timeout");
      unaff_R12 = 0x1c;
    }
    else {
      local_954 = conn->sock[local_950];
      ssl_sessionid = (void *)0x0;
      cVar1 = (conn->http_proxy).proxytype;
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar16 = 0x130, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar16 = 0xa0;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar42 = 0x308, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar42 = 0x298;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar46 = 0x690, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar46 = 0x5c0;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar50 = 0x6c0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar50 = 0x5f0;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar47 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar47 = 0x2f0;
      }
      pcVar3 = *(curl_blob **)((conn->chunk).hexbuffer + lVar47 + -0x3d);
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar47 = 0x710, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar47 = 0x640;
      }
      if (pcVar3 == (curl_blob *)0x0) {
        if ((cVar1 != CURLPROXY_HTTPS) ||
           (lVar48 = 800, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
          lVar48 = 0x2b0;
        }
        local_9b8 = *(X509 **)((conn->chunk).hexbuffer + lVar48 + -0x3d);
      }
      else {
        local_9b8 = (X509 *)0x0;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar48 = 0x318, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar48 = 0x2a8;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar49 = 0x370, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar49 = 0x300;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar40 = 0x6e8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar40 = 0x618;
      }
      local_9a8 = (X509 *)CONCAT44(local_9a8._4_4_,
                                   (uint)(byte)(conn->chunk).hexbuffer[lVar49 + -0x3d]);
      local_980 = *(char **)((conn->chunk).hexbuffer + lVar16 + -0x3d);
      uVar20 = *(ulong *)((conn->chunk).hexbuffer + lVar42 + -0x3d);
      local_9b0 = *(ssl_backend_data **)((long)&data->magic + lVar46);
      local_9c0 = *(BIO **)((long)&data->magic + lVar50);
      local_9d8 = *(ssl_backend_data **)((long)&data->magic + lVar47);
      local_970 = *(char **)((conn->chunk).hexbuffer + lVar48 + -0x3d);
      local_9d0 = *(BIO **)((long)&data->magic + lVar40);
      psVar21 = conn->ssl[lVar14].backend;
      CVar8 = ossl_seed(data);
      unaff_R12 = (ulong)CVar8;
      if (CVar8 != CURLE_OK) goto LAB_00152656;
      if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
         (lVar16 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar16 = 0x610;
      }
      *(undefined8 *)((long)&data->magic + lVar16) = 1;
      if (uVar20 < 8) {
        if ((0xf3UL >> (uVar20 & 0x3f) & 1) == 0) {
          if (uVar20 == 2) {
            pcVar18 = "No SSLv2 support";
          }
          else {
            pcVar18 = "No SSLv3 support";
          }
          Curl_failf(data,pcVar18);
LAB_00153b62:
          unaff_R12 = 4;
          goto LAB_00152656;
        }
        meth = (SSL_METHOD *)TLS_client_method();
        if ((SSL_CTX *)psVar21->ctx != (SSL_CTX *)0x0) {
          SSL_CTX_free((SSL_CTX *)psVar21->ctx);
        }
        pSVar23 = SSL_CTX_new(meth);
        psVar21->ctx = (SSL_CTX *)pSVar23;
        if (pSVar23 == (SSL_CTX *)0x0) {
          uVar20 = ERR_peek_error();
          ossl_strerror(uVar20,error_buffer,size_00);
          Curl_failf(data,"SSL: couldn\'t create a context: %s",error_buffer);
LAB_00153a04:
          unaff_R12 = 0x1b;
        }
        else {
          SSL_CTX_ctrl(pSVar23,0x21,0x10,(void *)0x0);
          if (((data->set).fdebug != (curl_debug_callback)0x0) &&
             (((data->set).field_0x9a3 & 0x40) != 0)) {
            SSL_CTX_set_msg_callback((SSL_CTX *)psVar21->ctx,ossl_trace);
            SSL_CTX_ctrl((SSL_CTX *)psVar21->ctx,0x10,0,conn);
            (conn->ssl[0].backend)->logger = data;
          }
          if (7 < uVar20) goto LAB_00153b6d;
          if ((0xf3UL >> (uVar20 & 0x3f) & 1) == 0) goto LAB_00153b62;
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar16 = 0x308, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar16 = 0x298;
          }
          lVar16 = *(long *)((conn->chunk).hexbuffer + lVar16 + -0x3d);
          if (lVar16 - 1U < 7) {
            lVar42 = *(long *)(&DAT_00163168 + lVar16 * 8);
          }
          else {
            lVar42 = 0;
          }
          pSVar23 = (SSL_CTX *)psVar21->ctx;
          if ((lVar16 == 0) || (lVar16 = SSL_CTX_ctrl(pSVar23,0x7b,lVar42,(void *)0x0), lVar16 != 0)
             ) {
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar16 = 0x310,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x2a0;
            }
            uVar20 = *(ulong *)((conn->chunk).hexbuffer + lVar16 + -0x3d);
            uVar5 = uVar20 << 0x30;
            uVar20 = uVar20 >> 0x10;
            larg = (uVar5 | uVar20) + 0x2fd;
            if ((uVar5 | uVar20 & 0xfffffffffffffffc) != 4) {
              larg = 0;
            }
            lVar16 = SSL_CTX_ctrl(pSVar23,0x7c,larg,(void *)0x0);
            unaff_R12 = 0x23;
            if (lVar16 != 0) {
              unaff_R12 = 0;
            }
          }
          else {
            unaff_R12 = 0x23;
          }
          if ((int)unaff_R12 != 0) goto LAB_00152656;
          SSL_CTX_set_options(psVar21->ctx);
          if (((conn->bits).field_0x7 & 8) != 0) {
            SSL_CTX_set_next_proto_select_cb((SSL_CTX *)psVar21->ctx,select_next_proto_cb,data);
          }
          if (((conn->bits).field_0x7 & 0x10) != 0) {
            builtin_strncpy(error_buffer,"\bhttp/1.1",9);
            Curl_infof(data,"ALPN, offering %s","http/1.1");
            iVar9 = SSL_CTX_set_alpn_protos(psVar21->ctx,error_buffer,9);
            if (iVar9 != 0) {
              pcVar18 = "Error setting ALPN";
              goto LAB_00153b78;
            }
          }
          if ((local_9b0 != (ssl_backend_data *)0x0 || local_9c0 != (BIO *)0x0) ||
              local_9d8 != (ssl_backend_data *)0x0) {
            cVar1 = (conn->http_proxy).proxytype;
            if ((cVar1 != CURLPROXY_HTTPS) ||
               (lVar16 = 0x718,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x648;
            }
            if ((cVar1 != CURLPROXY_HTTPS) ||
               (lVar42 = 0x720,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar42 = 0x650;
            }
            if ((cVar1 != CURLPROXY_HTTPS) ||
               (lVar46 = 0x728,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar46 = 0x658;
            }
            if ((cVar1 != CURLPROXY_HTTPS) ||
               (lVar50 = 0x730,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar50 = 0x660;
            }
            iVar9 = cert_stuff(data,psVar21->ctx,(char *)local_9b0,(curl_blob *)local_9c0,
                               (char *)local_9d8,*(char **)((long)&data->magic + lVar16),
                               *(curl_blob **)((long)&data->magic + lVar42),
                               *(char **)((long)&data->magic + lVar46),
                               *(char **)((long)&data->magic + lVar50));
            unaff_R12 = 0x3a;
            if (iVar9 == 0) goto LAB_00152656;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar16 = 0x340, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar16 = 0x2d0;
          }
          pcVar18 = *(char **)((conn->chunk).hexbuffer + lVar16 + -0x3d);
          if (pcVar18 != (char *)0x0) {
            iVar9 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar21->ctx,pcVar18);
            if (iVar9 == 0) {
              Curl_failf(data,"failed setting cipher list: %s",pcVar18);
              unaff_R12 = 0x3b;
              goto LAB_00152656;
            }
            Curl_infof(data,"Cipher selection: %s",pcVar18);
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar16 = 0x348, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar16 = 0x2d8;
          }
          lVar16 = *(long *)((conn->chunk).hexbuffer + lVar16 + -0x3d);
          unaff_R12 = 0x23;
          bVar53 = true;
          if (lVar16 != 0) {
            iVar9 = SSL_CTX_set_ciphersuites(psVar21->ctx,lVar16);
            if (iVar9 == 0) {
              bVar53 = false;
              Curl_failf(data,"failed setting TLS 1.3 cipher suite: %s",lVar16);
              unaff_R12 = 0x3b;
            }
            else {
              Curl_infof(data,"TLS 1.3 cipher selection: %s",lVar16);
            }
          }
          if (bVar53) {
            SSL_CTX_set_post_handshake_auth(psVar21->ctx);
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar16 = 0x368,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x2f8;
            }
            pvVar36 = *(void **)((conn->chunk).hexbuffer + lVar16 + -0x3d);
            bVar53 = true;
            if ((pvVar36 != (void *)0x0) &&
               (lVar16 = SSL_CTX_ctrl((SSL_CTX *)psVar21->ctx,0x5c,0,pvVar36), lVar16 == 0)) {
              bVar53 = false;
              Curl_failf(data,"failed setting curves list: \'%s\'",pvVar36);
              unaff_R12 = 0x3b;
            }
            if (bVar53) {
              uVar10 = (uint)local_9a8 & 1;
              cVar52 = (char)uVar10;
              if ((pcVar3 == (curl_blob *)0x0) ||
                 (CVar8 = load_cacert_from_memory(psVar21->ctx,pcVar3), CVar8 == CURLE_OK)) {
LAB_00154c89:
                pXVar27 = local_9b8;
                if (local_9b8 == (X509 *)0x0) {
LAB_00154cc1:
                  pcVar18 = local_970;
                  if (local_970 != (char *)0x0) {
                    iVar9 = SSL_CTX_load_verify_dir(psVar21->ctx,local_970);
                    if (iVar9 == 0) {
                      if (cVar52 != '\0') {
                        pcVar18 = "error setting certificate path: %s";
                        pXVar27 = (X509 *)local_970;
                        goto LAB_00154e54;
                      }
                      Curl_infof(data,"error setting certificate path, continuing anyway");
                      pcVar18 = local_970;
                    }
                    Curl_infof(data," CApath: %s",pcVar18);
                  }
                  if (local_9d0 != (BIO *)0x0) {
                    pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar21->ctx);
                    m = X509_LOOKUP_file();
                    ctx = X509_STORE_add_lookup(pXVar39,m);
                    if ((ctx == (X509_LOOKUP *)0x0) ||
                       (iVar9 = X509_load_crl_file(ctx,(char *)local_9d0,1), iVar9 == 0)) {
                      Curl_failf(data,"error loading CRL file: %s",local_9d0);
                      unaff_R12 = 0x52;
                      goto LAB_00152656;
                    }
                    Curl_infof(data,"successfully load CRL file:");
                    pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar21->ctx);
                    X509_STORE_set_flags(pXVar39,0xc);
                    Curl_infof(data,"  CRLfile: %s",local_9d0);
                  }
                  if (cVar52 != '\0') {
                    pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar21->ctx);
                    X509_STORE_set_flags(pXVar39,0x8000);
                    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                      if (local_9d0 == (BIO *)0x0) {
                        bVar6 = (data->set).proxy_ssl.field_0xc8;
LAB_00154ec5:
                        if ((bVar6 & 0x10) == 0) {
                          pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar21->ctx);
                          X509_STORE_set_flags(pXVar39,0x80000);
                        }
                      }
                    }
                    else if (local_9d0 == (BIO *)0x0) {
                      bVar6 = (data->set).ssl.field_0xc8;
                      goto LAB_00154ec5;
                    }
                  }
                  SSL_CTX_set_verify((SSL_CTX *)psVar21->ctx,uVar10,(callback *)0x0);
                  _Var7 = Curl_tls_keylog_enabled();
                  if (_Var7) {
                    SSL_CTX_set_keylog_callback(psVar21->ctx,ossl_keylog_callback);
                  }
                  SSL_CTX_ctrl((SSL_CTX *)psVar21->ctx,0x2c,0x301,(void *)0x0);
                  SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar21->ctx,ossl_new_session_cb);
                  if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
                    Curl_set_in_callback(data,true);
                    CVar8 = (*(data->set).ssl.fsslctx)(data,psVar21->ctx,(data->set).ssl.fsslctxp);
                    Curl_set_in_callback(data,false);
                    if (CVar8 != CURLE_OK) {
                      pcVar18 = "error signaled by ssl ctx callback";
                      goto LAB_00154f7e;
                    }
                  }
                  if ((SSL *)psVar21->handle != (SSL *)0x0) {
                    SSL_free((SSL *)psVar21->handle);
                  }
                  ssl = SSL_new((SSL_CTX *)psVar21->ctx);
                  psVar21->handle = (SSL *)ssl;
                  if (ssl == (SSL *)0x0) {
                    Curl_failf(data,"SSL: couldn\'t create a context (handle)!");
                    goto LAB_00153a04;
                  }
                  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
                     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
                    bVar6 = (conn->proxy_ssl_config).field_0x68;
                  }
                  else {
                    bVar6 = (conn->ssl_config).field_0x68;
                  }
                  if ((bVar6 & 4) != 0) {
                    SSL_ctrl(ssl,0x41,1,(void *)0x0);
                  }
                  SSL_set_connect_state((SSL *)psVar21->handle);
                  psVar21->server_cert = (X509 *)0x0;
                  iVar9 = inet_pton(2,local_980,&addr);
                  if ((iVar9 == 0) && (iVar9 = inet_pton(10,local_980,&addr), iVar9 == 0)) {
                    sVar37 = strlen(local_980);
                    lVar16 = (data->set).buffer_size;
                    uVar10 = 0x23;
                    if ((long)sVar37 < lVar16) {
                      Curl_strntolower((data->state).buffer,local_980,sVar37);
                      (data->state).buffer[sVar37] = '\0';
                      lVar42 = SSL_ctrl((SSL *)psVar21->handle,0x37,0,(data->state).buffer);
                      if (lVar42 == 0) {
                        Curl_infof(data,
                                   "WARNING: failed to configure server name indication (SNI) TLS extension"
                                  );
                      }
                      uVar10 = (uint)unaff_R12;
                    }
                    unaff_R12 = (ulong)uVar10;
                    if (lVar16 <= (long)sVar37) goto LAB_00152656;
                  }
                  ossl_associate_connection(data,conn,sockindex);
                  Curl_ssl_sessionid_lock(data);
                  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
                    _Var7 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete;
                  }
                  else {
                    _Var7 = false;
                  }
                  _Var7 = Curl_ssl_getsessionid
                                    (data,conn,_Var7,&ssl_sessionid,(size_t *)0x0,sockindex);
                  if (!_Var7) {
                    iVar9 = SSL_set_session((SSL *)psVar21->handle,(SSL_SESSION *)ssl_sessionid);
                    if (iVar9 != 0) {
                      Curl_infof(data,"SSL re-using session ID");
                      goto LAB_00155196;
                    }
                    Curl_ssl_sessionid_unlock(data);
                    uVar20 = ERR_get_error();
                    ossl_strerror(uVar20,error_buffer,size_04);
                    pcVar18 = "SSL: SSL_set_session failed: %s";
LAB_0015528e:
                    Curl_failf(data,pcVar18,error_buffer);
                    goto LAB_00153b7f;
                  }
LAB_00155196:
                  Curl_ssl_sessionid_unlock(data);
                  if ((conn->proxy_ssl[lVar14].field_0x10 & 1) == 0) {
                    iVar9 = SSL_set_fd((SSL *)psVar21->handle,local_954);
                    if (iVar9 == 0) {
                      uVar20 = ERR_get_error();
                      ossl_strerror(uVar20,error_buffer,size_03);
                      pcVar18 = "SSL: SSL_set_fd failed: %s";
                      goto LAB_0015528e;
                    }
                  }
                  else {
                    pBVar24 = BIO_f_ssl();
                    pBVar25 = BIO_new(pBVar24);
                    BIO_ctrl(pBVar25,0x6d,0,(conn->proxy_ssl[lVar14].backend)->handle);
                    SSL_set_bio((SSL *)psVar21->handle,pBVar25,pBVar25);
                  }
                  conn->ssl[lVar14].connecting_state = ssl_connect_2;
                  unaff_R12 = 0;
                }
                else {
                  iVar9 = SSL_CTX_load_verify_file(psVar21->ctx,local_9b8);
                  if (iVar9 != 0) {
LAB_00154cac:
                    Curl_infof(data," CAfile: %s",pXVar27);
                    goto LAB_00154cc1;
                  }
                  if (cVar52 == '\0') {
                    Curl_infof(data,"error setting certificate file, continuing anyway");
                    pXVar27 = local_9b8;
                    goto LAB_00154cac;
                  }
                  pcVar18 = "error setting certificate file: %s";
                  pXVar27 = local_9b8;
LAB_00154e54:
                  Curl_failf(data,pcVar18,pXVar27);
                  unaff_R12 = 0x4d;
                }
              }
              else {
                if ((CVar8 != CURLE_OUT_OF_MEMORY) && (cVar52 == '\0')) {
                  Curl_infof(data,"error importing CA certificate blob, continuing anyway");
                  goto LAB_00154c89;
                }
                pcVar18 = "error importing CA certificate blob";
LAB_00154f7e:
                Curl_failf(data,pcVar18);
                unaff_R12 = (ulong)CVar8;
              }
            }
          }
        }
      }
      else {
LAB_00153b6d:
        pcVar18 = "Unrecognized parameter passed via CURLOPT_SSLVERSION";
LAB_00153b78:
        Curl_failf(data,pcVar18);
LAB_00153b7f:
        unaff_R12 = 0x23;
      }
LAB_00152656:
      bVar53 = (int)unaff_R12 == 0;
    }
    if (!bVar53) {
      return (CURLcode)unaff_R12;
    }
  }
  local_9b8 = (X509 *)&(data->set).proxy_ssl.certverifyresult;
  local_9a8 = (X509 *)&(data->set).ssl.certverifyresult;
  local_9d8 = (ssl_backend_data *)&(conn->http_proxy).host.name;
  local_9b0 = (ssl_backend_data *)&(conn->host).name;
  local_9d0 = (BIO *)&conn->port;
  local_9c0 = (BIO *)&conn->remote_port;
  while (sVar2 = conn->ssl[lVar14].connecting_state, sVar2 - ssl_connect_2 < 3) {
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 0) {
      bVar53 = false;
      Curl_failf(data,"SSL connection timeout");
      unaff_R12 = 0x1c;
    }
    else {
      sVar2 = conn->ssl[lVar14].connecting_state;
      if ((sVar2 & ~ssl_connect_2) == ssl_connect_2_reading) {
        writefd = -1;
        if (sVar2 == ssl_connect_2_writing) {
          writefd = (curl_socket_t)local_9c8;
        }
        readfd0 = -1;
        if (sVar2 == ssl_connect_2_reading) {
          readfd0 = (curl_socket_t)local_9c8;
        }
        if ((char)local_9e0 != '\0') {
          tVar15 = 0;
        }
        iVar9 = Curl_socket_check(readfd0,-1,writefd,tVar15);
        if (iVar9 < 0) {
          puVar17 = (uint *)__errno_location();
          bVar53 = false;
          Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar17);
          unaff_R12 = 0x23;
        }
        else {
          bVar53 = true;
          if (iVar9 == 0) {
            if ((char)local_9e0 == '\0') {
              bVar53 = false;
              Curl_failf(data,"SSL connection timeout");
              unaff_R12 = 0x1c;
            }
            else {
              *local_948 = false;
              bVar53 = false;
              unaff_R12 = 0;
            }
          }
        }
        if (!bVar53) {
          bVar53 = false;
          goto LAB_00152b8f;
        }
      }
      psVar21 = conn->ssl[lVar14].backend;
      ERR_clear_error();
      iVar9 = SSL_connect((SSL *)psVar21->handle);
      if (iVar9 == 1) {
        conn->ssl[lVar14].connecting_state = ssl_connect_3;
        pcVar18 = SSL_get_version((SSL *)psVar21->handle);
        c = SSL_get_current_cipher((SSL *)psVar21->handle);
        pcVar19 = SSL_CIPHER_get_name(c);
        Curl_infof(data,"SSL connection using %s / %s",pcVar18,pcVar19);
        uVar51 = 0;
        if (((conn->bits).field_0x7 & 0x10) != 0) {
          SSL_get0_alpn_selected(psVar21->handle,error_buffer,&addr);
          if (addr.__in6_u.__u6_addr32[0] == 0) {
            Curl_infof(data,"ALPN, server did not agree to a protocol");
          }
          else {
            Curl_infof(data,"ALPN, server accepted to use %.*s",addr.__in6_u._0_8_ & 0xffffffff,
                       CONCAT71(error_buffer._1_7_,error_buffer[0]));
            if ((addr.__in6_u.__u6_addr32[0] == 8) &&
               (*(long *)CONCAT71(error_buffer._1_7_,error_buffer[0]) == 0x312e312f70747468)) {
              conn->negnpn = 2;
            }
          }
          Curl_multiuse_state(data,(uint)(conn->negnpn == 3) * 3 + -1);
          uVar51 = 0;
        }
      }
      else {
        uVar10 = SSL_get_error((SSL *)psVar21->handle,iVar9);
        if (uVar10 == 9) {
          conn->ssl[lVar14].connecting_state = ssl_connect_2;
        }
        else if (uVar10 == 3) {
          conn->ssl[lVar14].connecting_state = ssl_connect_2_writing;
        }
        else {
          if (uVar10 != 2) {
            memset(error_buffer,0,0x100);
            conn->ssl[lVar14].connecting_state = ssl_connect_2;
            uVar20 = ERR_get_error();
            uVar51 = (uint)uVar20;
            bVar53 = (int)uVar51 < 0;
            uVar11 = 0x7fffffff;
            if (!bVar53) {
              uVar11 = 0x7fffff;
            }
            uVar11 = uVar11 & uVar51;
            bVar54 = (uVar51 & 0xff800000) != 0xa000000;
            if ((bVar54 || bVar53) || ((uVar11 != 0x415 && (uVar11 != 0x86)))) {
              ossl_strerror(uVar20,error_buffer,(ulong)(uVar51 & 0xff800000));
              bVar44 = (bVar54 || bVar53) || uVar11 != 0x45c;
              uVar51 = 0x23;
              if ((!bVar54 && !bVar53) && uVar11 == 0x45c) {
                uVar51 = 0x62;
              }
            }
            else {
              n = (X509_CINF *)SSL_get_verify_result((SSL *)psVar21->handle);
              if (n == (X509_CINF *)0x0) {
                error_buffer[0x10] = 'v';
                error_buffer[0x11] = 'e';
                error_buffer[0x12] = 'r';
                error_buffer[0x13] = 'i';
                error_buffer[0x14] = 'f';
                error_buffer[0x15] = 'i';
                error_buffer[0x16] = 'c';
                error_buffer[0x17] = 'a';
                error_buffer[0x18] = 't';
                error_buffer[0x19] = 'i';
                error_buffer[0x1a] = 'o';
                error_buffer[0x1b] = 'n';
                error_buffer[0x1c] = ' ';
                error_buffer[0x1d] = 'f';
                error_buffer[0x1e] = 'a';
                error_buffer[0x1f] = 'i';
                builtin_strncpy(error_buffer,"SSL certificate ",0x10);
                builtin_strncpy(error_buffer + 0x20,"led",4);
                bVar44 = false;
                uVar51 = 0x3c;
              }
              else {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (pXVar27 = local_9b8,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  pXVar27 = local_9a8;
                }
                pXVar27->cert_info = n;
                pcVar18 = X509_verify_cert_error_string((long)n);
                bVar44 = false;
                curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar18);
                uVar51 = 0x3c;
              }
            }
            if ((uVar20 == 0) && (bVar44)) {
              cVar1 = (conn->http_proxy).proxytype;
              if ((cVar1 != CURLPROXY_HTTPS) ||
                 (psVar21 = local_9d8,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                psVar21 = local_9b0;
              }
              if ((cVar1 != CURLPROXY_HTTPS) ||
                 (pBVar25 = local_9d0,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                pBVar25 = local_9c0;
              }
              pCVar4 = psVar21->logger;
              iVar9 = *(int *)&pBVar25->method;
              addr.__in6_u._0_8_ = 0;
              addr.__in6_u._8_8_ = 0;
              piVar22 = __errno_location();
              if (uVar10 == 5 && *piVar22 != 0) {
                Curl_strerror(*piVar22,(char *)&addr,0x50);
              }
              pcVar18 = (char *)&addr;
              if ((addr.__in6_u.__u6_addr8[0] == '\0') &&
                 (pcVar18 = "SSL_ERROR unknown", uVar10 < 0xb)) {
                pcVar18 = (&PTR_anon_var_dwarf_130f9e_00174c38)[uVar10];
              }
              Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar18,pCVar4,
                         (long)iVar9);
            }
            else {
              Curl_failf(data,"%s",error_buffer);
            }
            goto LAB_00152b65;
          }
          conn->ssl[lVar14].connecting_state = ssl_connect_2_reading;
        }
        uVar51 = 0;
      }
LAB_00152b65:
      if ((uVar51 == 0) &&
         (((char)local_9e0 == '\0' || (2 < conn->ssl[lVar14].connecting_state - ssl_connect_2)))) {
        bVar53 = true;
      }
      else {
        bVar53 = false;
        unaff_R12 = (ulong)uVar51;
      }
    }
LAB_00152b8f:
    if (!bVar53) {
      return (CURLcode)unaff_R12;
    }
  }
  if (sVar2 != ssl_connect_3) goto LAB_00154511;
  cVar1 = (conn->http_proxy).proxytype;
  if ((cVar1 == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    bVar6 = (conn->proxy_ssl_config).field_0x68;
  }
  else {
    bVar6 = (conn->ssl_config).field_0x68;
  }
  bVar43 = 1;
  if ((bVar6 & 1) == 0) {
    if ((cVar1 != CURLPROXY_HTTPS) ||
       (lVar16 = 0x370, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar16 = 0x300;
    }
    bVar43 = ((conn->chunk).hexbuffer[lVar16 + -0x3d] & 2U) >> 1;
  }
  local_9c0 = (BIO *)CONCAT71(local_9c0._1_7_,bVar43);
  memset(&addr,0,0x100);
  pBVar24 = BIO_s_mem();
  pBVar25 = BIO_new(pBVar24);
  psVar21 = conn->ssl[lVar14].backend;
  if ((((data->set).ssl.field_0xc8 & 1) != 0) &&
     (psVar26 = SSL_get_peer_cert_chain((SSL *)psVar21->handle), psVar26 != (stack_st_X509 *)0x0)) {
    iVar9 = OPENSSL_sk_num(psVar26);
    CVar8 = Curl_ssl_init_certinfo(data,iVar9);
    if (CVar8 == CURLE_OK) {
      local_9d8 = psVar21;
      local_9d0 = pBVar25;
      pBVar24 = BIO_s_mem();
      pBVar25 = BIO_new(pBVar24);
      if (0 < iVar9) {
        iVar12 = 0;
        local_9b0 = (ssl_backend_data *)CONCAT44(local_9b0._4_4_,iVar9);
        do {
          pXVar27 = (X509 *)OPENSSL_sk_value(psVar26,iVar12);
          psig = (ASN1_BIT_STRING *)0x0;
          pXVar28 = X509_get_subject_name(pXVar27);
          X509_NAME_print_ex(pBVar25,pXVar28,0,0x82031f);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Subject",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          pXVar28 = X509_get_issuer_name(pXVar27);
          X509_NAME_print_ex(pBVar25,pXVar28,0,0x82031f);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Issuer",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          uVar30 = X509_get_version(pXVar27);
          BIO_printf(pBVar25,"%lx",uVar30);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Version",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          local_9c8 = pXVar27;
          pAVar31 = X509_get_serialNumber(pXVar27);
          if (pAVar31->type == 0x102) {
            BIO_puts(pBVar25,"-");
          }
          if (0 < pAVar31->length) {
            lVar16 = 0;
            do {
              BIO_printf(pBVar25,"%02x",(ulong)pAVar31->data[lVar16]);
              lVar16 = lVar16 + 1;
            } while (lVar16 < pAVar31->length);
          }
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Serial Number",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          sigalg = (X509_ALGOR *)0x0;
          pubkeyoid = (ASN1_OBJECT *)0x0;
          X509_get0_signature(&psig,&sigalg,local_9c8);
          if (sigalg != (X509_ALGOR *)0x0) {
            i2a_ASN1_OBJECT(pBVar25,(ASN1_OBJECT *)sigalg->algorithm);
            sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar12,"Signature Algorithm",ptr,sVar29);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
          }
          pXVar32 = (X509_PUBKEY *)X509_get_X509_PUBKEY(local_9c8);
          if ((pXVar32 != (X509_PUBKEY *)0x0) &&
             (X509_PUBKEY_get0_param
                        ((ASN1_OBJECT **)&pubkeyoid,(uchar **)0x0,(int *)0x0,(X509_ALGOR **)0x0,
                         pXVar32), pubkeyoid != (ASN1_OBJECT *)0x0)) {
            i2a_ASN1_OBJECT(pBVar25,(ASN1_OBJECT *)pubkeyoid);
            sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar12,"Public Key Algorithm",ptr,sVar29);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
          }
          local_9e0 = (X509 *)CONCAT44(local_9e0._4_4_,iVar12);
          uVar30 = X509_get0_extensions(local_9c8);
          iVar9 = OPENSSL_sk_num(uVar30);
          if ((0 < iVar9) && (iVar9 = OPENSSL_sk_num(uVar30), 0 < iVar9)) {
            iVar9 = 0;
            do {
              ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar30,iVar9);
              pBVar24 = BIO_s_mem();
              pBVar33 = BIO_new(pBVar24);
              if (pBVar33 == (BIO *)0x0) break;
              a = X509_EXTENSION_get_object(ex);
              i2t_ASN1_OBJECT(error_buffer,0x80,a);
              iVar12 = X509V3_EXT_print(pBVar33,ex,0,0);
              if (iVar12 == 0) {
                v = X509_EXTENSION_get_data(ex);
                ASN1_STRING_print(pBVar33,v);
              }
              BIO_ctrl(pBVar33,0x73,0,&ssl_sessionid);
              Curl_ssl_push_certinfo_len
                        (data,(int)local_9e0,error_buffer,*(char **)((long)ssl_sessionid + 8),
                         *ssl_sessionid);
              BIO_free(pBVar33);
              iVar9 = iVar9 + 1;
              iVar12 = OPENSSL_sk_num(uVar30);
            } while (iVar9 < iVar12);
          }
          pXVar27 = local_9c8;
          pAVar34 = (ASN1_TIME *)X509_get0_notBefore(local_9c8);
          ASN1_TIME_print(pBVar25,pAVar34);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          iVar12 = (int)local_9e0;
          Curl_ssl_push_certinfo_len(data,(int)local_9e0,"Start date",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          pAVar34 = (ASN1_TIME *)X509_get0_notAfter(pXVar27);
          ASN1_TIME_print(pBVar25,pAVar34);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Expire date",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          pkey = X509_get_pubkey(pXVar27);
          if (pkey == (EVP_PKEY *)0x0) {
            Curl_infof(data,"   Unable to load public key");
          }
          else {
            iVar9 = EVP_PKEY_get_id(pkey);
            if (iVar9 == 0x74) {
              uVar30 = EVP_PKEY_get0_DSA(pkey);
              DSA_get0_pqg(uVar30,error_buffer,&ssl_sessionid,&sigalg);
              DSA_get0_key(uVar30,&pubkeyoid,0);
              bn = (BIGNUM *)CONCAT71(error_buffer._1_7_,error_buffer[0]);
              pcVar18 = "dsa";
LAB_0015344c:
              pubkey_show(data,(BIO *)pBVar25,iVar12,pcVar18,"p",bn);
              pubkey_show(data,(BIO *)pBVar25,iVar12,pcVar18,"q",(BIGNUM *)ssl_sessionid);
              pubkey_show(data,(BIO *)pBVar25,iVar12,pcVar18,"g",(BIGNUM *)sigalg);
              pcVar19 = "pub_key";
              bn_00 = pubkeyoid;
LAB_001534b0:
              pubkey_show(data,(BIO *)pBVar25,iVar12,pcVar18,pcVar19,(BIGNUM *)bn_00);
            }
            else {
              if (iVar9 == 0x1c) {
                uVar30 = EVP_PKEY_get0_DH(pkey);
                DH_get0_pqg(uVar30,error_buffer,&ssl_sessionid,&sigalg);
                DH_get0_key(uVar30,&pubkeyoid,0);
                bn = (BIGNUM *)CONCAT71(error_buffer._1_7_,error_buffer[0]);
                pcVar18 = "dh";
                goto LAB_0015344c;
              }
              if (iVar9 == 6) {
                uVar30 = EVP_PKEY_get0_RSA(pkey);
                RSA_get0_key(uVar30,error_buffer,&ssl_sessionid,0);
                uVar10 = BN_num_bits((BIGNUM *)CONCAT71(error_buffer._1_7_,error_buffer[0]));
                BIO_printf(pBVar25,"%d",(ulong)uVar10);
                sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
                Curl_ssl_push_certinfo_len(data,iVar12,"RSA Public Key",ptr,sVar29);
                BIO_ctrl(pBVar25,1,0,(void *)0x0);
                pubkey_show(data,(BIO *)pBVar25,iVar12,"rsa","n",
                            (BIGNUM *)CONCAT71(error_buffer._1_7_,error_buffer[0]));
                pcVar18 = "rsa";
                pcVar19 = "e";
                bn_00 = (ASN1_OBJECT *)ssl_sessionid;
                goto LAB_001534b0;
              }
            }
            EVP_PKEY_free(pkey);
          }
          if (psig != (ASN1_BIT_STRING *)0x0) {
            if (0 < psig->length) {
              lVar16 = 0;
              do {
                BIO_printf(pBVar25,"%02x:",(ulong)psig->data[lVar16]);
                lVar16 = lVar16 + 1;
              } while (lVar16 < psig->length);
            }
            sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
            Curl_ssl_push_certinfo_len(data,iVar12,"Signature",ptr,sVar29);
            BIO_ctrl(pBVar25,1,0,(void *)0x0);
          }
          PEM_write_bio_X509(pBVar25,local_9c8);
          sVar29 = BIO_ctrl(pBVar25,3,0,&ptr);
          Curl_ssl_push_certinfo_len(data,iVar12,"Cert",ptr,sVar29);
          BIO_ctrl(pBVar25,1,0,(void *)0x0);
          iVar12 = iVar12 + 1;
        } while (iVar12 != (int)local_9b0);
      }
      BIO_free(pBVar25);
      pBVar25 = local_9d0;
      psVar21 = local_9d8;
    }
  }
  pXVar35 = (X509 *)SSL_get1_peer_certificate(psVar21->handle);
  psVar21->server_cert = pXVar35;
  if (pXVar35 == (X509 *)0x0) {
    BIO_free(pBVar25);
    CVar8 = CURLE_OK;
    if ((char)local_9c0 != '\0') {
      Curl_failf(data,"SSL: couldn\'t get peer certificate!");
      CVar8 = CURLE_PEER_FAILED_VERIFICATION;
    }
  }
  else {
    if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
      pcVar18 = "Proxy";
      if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
        pcVar18 = "Server";
      }
    }
    else {
      pcVar18 = "Server";
    }
    Curl_infof(data,"%s certificate:",pcVar18);
    pXVar28 = X509_get_subject_name((X509 *)psVar21->server_cert);
    iVar9 = x509_name_oneline((X509_NAME *)pXVar28,error_buffer,size);
    pcVar18 = "[NONE]";
    if (iVar9 == 0) {
      pcVar18 = error_buffer;
    }
    Curl_infof(data," subject: %s",pcVar18);
    pAVar34 = (ASN1_TIME *)X509_get0_notBefore(psVar21->server_cert);
    ASN1_TIME_print(pBVar25,pAVar34);
    uVar20 = BIO_ctrl(pBVar25,3,0,&local_940);
    Curl_infof(data," start date: %.*s",uVar20 & 0xffffffff);
    BIO_ctrl(pBVar25,1,0,(void *)0x0);
    pAVar34 = (ASN1_TIME *)X509_get0_notAfter(psVar21->server_cert);
    ASN1_TIME_print(pBVar25,pAVar34);
    uVar20 = BIO_ctrl(pBVar25,3,0,&local_940);
    Curl_infof(data," expire date: %.*s",uVar20 & 0xffffffff);
    BIO_ctrl(pBVar25,1,0,(void *)0x0);
    BIO_free(pBVar25);
    cVar1 = (conn->http_proxy).proxytype;
    if ((cVar1 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar6 = (conn->proxy_ssl_config).field_0x68;
    }
    else {
      bVar6 = (conn->ssl_config).field_0x68;
    }
    local_9d8 = psVar21;
    if ((bVar6 & 2) != 0) {
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar16 = 0x130, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar16 = 0xa0;
      }
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar42 = 0x138, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar42 = 0xa8;
      }
      local_9b8 = (X509 *)psVar21->server_cert;
      pcVar18 = *(char **)((conn->chunk).hexbuffer + lVar16 + -0x3d);
      local_9a8 = *(X509 **)((conn->chunk).hexbuffer + lVar42 + -0x3d);
      local_970 = pcVar18;
      if ((((conn->bits).field_0x5 & 0x10) == 0) ||
         (iVar9 = inet_pton(10,pcVar18,&ssl_sessionid), iVar9 == 0)) {
        iVar9 = inet_pton(2,pcVar18,&ssl_sessionid);
        local_9d0 = (BIO *)(ulong)((uint)(iVar9 != 0) * 4);
        iVar9 = (uint)(iVar9 != 0) * 5 + 2;
      }
      else {
        iVar9 = 7;
        local_9d0 = (BIO *)0x10;
      }
      CVar8 = CURLE_OK;
      psVar21 = (ssl_backend_data *)0x0;
      pXVar27 = (X509 *)X509_get_ext_d2i(local_9b8,0x55,(int *)0x0,(int *)0x0);
      if (pXVar27 == (X509 *)0x0) {
        bVar6 = 0;
        bVar43 = 0;
      }
      else {
        local_9e0 = pXVar27;
        iVar12 = OPENSSL_sk_num(pXVar27);
        local_9c8 = (X509 *)CONCAT44(local_9c8._4_4_,iVar12);
        if (iVar12 < 1) {
          bVar6 = 0;
          bVar43 = 0;
        }
        else {
          iVar12 = 1;
          local_9f8 = (ssl_backend_data *)0x0;
          local_9b0 = (ssl_backend_data *)0x0;
          local_980 = (char *)0x0;
          bVar53 = false;
          do {
            piVar22 = (int *)OPENSSL_sk_value(local_9e0,iVar12 + -1);
            iVar13 = *piVar22;
            uVar41 = (undefined7)((ulong)psVar21 >> 8);
            if (iVar13 == 2) {
              psVar21 = (ssl_backend_data *)CONCAT71(uVar41,1);
              local_9f8 = psVar21;
            }
            else if (iVar13 == 7) {
              psVar21 = (ssl_backend_data *)CONCAT71(uVar41,1);
              local_9b0 = psVar21;
            }
            if (iVar13 == iVar9) {
              __s = (ssl_backend_data *)ASN1_STRING_get0_data(*(undefined8 *)(piVar22 + 2));
              iVar13 = ASN1_STRING_length(*(ASN1_STRING **)(piVar22 + 2));
              pBVar25 = (BIO *)(long)iVar13;
              if (iVar9 == 7) {
                if ((local_9d0 == pBVar25) &&
                   (iVar13 = bcmp(__s,&ssl_sessionid,(size_t)pBVar25), iVar13 == 0)) {
                  Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s IP address!",
                             local_9a8);
                  local_980 = (char *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
              }
              else if (((iVar9 == 2) && (pBVar33 = (BIO *)strlen((char *)__s), pBVar33 == pBVar25))
                      && (iVar13 = Curl_cert_hostcheck((char *)__s,local_970), iVar13 != 0)) {
                Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_9a8,__s)
                ;
                bVar53 = true;
                psVar21 = __s;
              }
            }
          } while ((iVar12 < (curl_socket_t)local_9c8) && (iVar12 = iVar12 + 1, !bVar53));
          bVar6 = (byte)local_9f8 | (byte)local_9b0;
          bVar43 = bVar53 | (byte)local_980;
        }
        GENERAL_NAMES_free((GENERAL_NAMES *)local_9e0);
      }
      pXVar27 = local_9a8;
      psVar21 = local_9d8;
      if ((bVar43 & 1) == 0) {
        if ((bVar6 & 1) == 0) {
          ptr = "";
          pXVar28 = X509_get_subject_name(local_9b8);
          if (pXVar28 == (X509_NAME *)0x0) {
            iVar9 = -1;
          }
          else {
            iVar12 = -1;
            do {
              iVar9 = iVar12;
              iVar12 = X509_NAME_get_index_by_NID(pXVar28,0xd,iVar9);
            } while (-1 < iVar12);
          }
          CVar8 = CURLE_OK;
          bVar53 = true;
          psVar21 = local_9d8;
          if (-1 < iVar9) {
            ne = X509_NAME_get_entry(pXVar28,iVar9);
            x = X509_NAME_ENTRY_get_data(ne);
            psVar21 = local_9d8;
            if (x != (ASN1_STRING *)0x0) {
              iVar9 = ASN1_STRING_type(x);
              psVar21 = local_9d8;
              if (iVar9 == 0xc) {
                uVar10 = ASN1_STRING_length(x);
                if ((-1 < (int)uVar10) &&
                   (pcVar18 = (char *)CRYPTO_malloc(uVar10 + 1,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rachelmorrell[P]curl/lib/vtls/openssl.c"
                                                  ,0x6fa), ptr = pcVar18, pcVar18 != (char *)0x0)) {
                  pvVar36 = (void *)ASN1_STRING_get0_data(x);
                  memcpy(pcVar18,pvVar36,(ulong)uVar10);
                  ptr[uVar10] = '\0';
                }
              }
              else {
                uVar10 = ASN1_STRING_to_UTF8((uchar **)&ptr,x);
              }
              if (ptr != (char *)0x0) {
                sVar37 = strlen(ptr);
                uVar11 = curlx_uztosi(sVar37);
                if (uVar11 != uVar10) {
                  bVar53 = false;
                  Curl_failf(data,"SSL: illegal cert name field");
                  CVar8 = CURLE_PEER_FAILED_VERIFICATION;
                }
              }
            }
          }
          if (ptr == "") {
            ptr = (char *)0x0;
          }
          if (bVar53) {
            if (ptr == (char *)0x0) {
              Curl_failf(data,"SSL: unable to obtain common name from peer certificate");
            }
            else {
              iVar9 = Curl_cert_hostcheck(ptr,local_970);
              if (iVar9 != 0) {
                CVar8 = CURLE_OK;
                Curl_infof(data," common name: %s (matched)");
                goto LAB_00154071;
              }
              Curl_failf(data,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,ptr,local_9a8);
            }
            CVar8 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_00154071:
          if (ptr != (char *)0x0) {
            CRYPTO_free(ptr);
          }
        }
        else {
          Curl_infof(data," subjectAltName does not match %s",local_9a8);
          Curl_failf(data,
                     "SSL: no alternative certificate subject name matches target host name \'%s\'",
                     pXVar27);
          CVar8 = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
      if (CVar8 != CURLE_OK) {
        X509_free((X509 *)psVar21->server_cert);
        psVar21->server_cert = (X509 *)0x0;
        goto LAB_00154500;
      }
    }
    pXVar28 = X509_get_issuer_name((X509 *)psVar21->server_cert);
    iVar9 = x509_name_oneline((X509_NAME *)pXVar28,error_buffer,size_01);
    if (iVar9 == 0) {
      Curl_infof(data," issuer: %s",error_buffer);
      cVar1 = (conn->http_proxy).proxytype;
      if ((cVar1 == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((data->set).proxy_ssl.issuercert == (char *)0x0) goto LAB_00154211;
LAB_00154574:
        if ((cVar1 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          if ((data->set).proxy_ssl.issuercert_blob != (curl_blob *)0x0) goto LAB_001545a7;
LAB_0015473c:
          pBVar24 = BIO_s_file();
          pBVar25 = BIO_new(pBVar24);
          if (pBVar25 == (BIO *)0x0) {
            uVar20 = ERR_get_error();
            ossl_strerror(uVar20,(char *)&addr,size_02);
            Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",&addr);
            X509_free((X509 *)psVar21->server_cert);
            psVar21->server_cert = (X509 *)0x0;
            CVar8 = CURLE_OUT_OF_MEMORY;
            goto LAB_00154500;
          }
          if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
             (lVar16 = 0x6f0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar16 = 0x620;
          }
          lVar16 = BIO_ctrl(pBVar25,0x6c,3,*(void **)((long)&data->magic + lVar16));
          if (0 < (int)lVar16) goto LAB_00154615;
          if ((char)local_9c0 != '\0') {
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar16 = 0x6f0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x620;
            }
            Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                       *(undefined8 *)((long)&data->magic + lVar16));
          }
          BIO_free(pBVar25);
        }
        else {
          if ((data->set).ssl.issuercert_blob == (curl_blob *)0x0) goto LAB_0015473c;
LAB_001545a7:
          if ((cVar1 != CURLPROXY_HTTPS) ||
             (lVar16 = 0x6f8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar16 = 0x628;
          }
          if ((cVar1 != CURLPROXY_HTTPS) ||
             (lVar42 = 0x6f8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar42 = 0x628;
          }
          pBVar25 = BIO_new_mem_buf((void *)**(undefined8 **)((long)&data->magic + lVar16),
                                    *(int *)(*(long *)((long)&data->magic + lVar42) + 8));
LAB_00154615:
          pXVar27 = PEM_read_bio_X509(pBVar25,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar27 != (X509 *)0x0) {
            iVar9 = X509_check_issued(pXVar27,(X509 *)psVar21->server_cert);
            if (iVar9 != 0) {
              if ((char)local_9c0 != '\0') {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (lVar16 = 0x6f0,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar16 = 0x620;
                }
                Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                           *(undefined8 *)((long)&data->magic + lVar16));
              }
              BIO_free(pBVar25);
              X509_free(pXVar27);
              X509_free((X509 *)psVar21->server_cert);
              psVar21->server_cert = (X509 *)0x0;
              CVar8 = CURLE_SSL_ISSUER_ERROR;
              goto LAB_00154500;
            }
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar16 = 0x6f0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x620;
            }
            Curl_infof(data," SSL certificate issuer check ok (%s)",
                       *(undefined8 *)((long)&data->magic + lVar16));
            BIO_free(pBVar25);
            X509_free(pXVar27);
            goto LAB_00154877;
          }
          if ((char)local_9c0 != '\0') {
            if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
               (lVar16 = 0x6f0,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar16 = 0x620;
            }
            Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                       *(undefined8 *)((long)&data->magic + lVar16));
          }
          BIO_free(pBVar25);
          X509_free((X509 *)0x0);
        }
        X509_free((X509 *)psVar21->server_cert);
        psVar21->server_cert = (X509 *)0x0;
        CVar8 = CURLE_SSL_ISSUER_ERROR;
        goto LAB_00154500;
      }
      if ((data->set).ssl.issuercert != (char *)0x0) goto LAB_00154574;
LAB_00154211:
      if ((cVar1 == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        pcVar3 = (data->set).proxy_ssl.issuercert_blob;
      }
      else {
        pcVar3 = (data->set).ssl.issuercert_blob;
      }
      if (pcVar3 != (curl_blob *)0x0) goto LAB_00154574;
LAB_00154877:
      lVar16 = SSL_get_verify_result((SSL *)psVar21->handle);
      cVar1 = (conn->http_proxy).proxytype;
      if ((cVar1 != CURLPROXY_HTTPS) ||
         (lVar42 = 0x6e0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar42 = 0x610;
      }
      *(long *)((long)&data->magic + lVar42) = lVar16;
      if (lVar16 == 0) {
        CVar45 = CURLE_OK;
        Curl_infof(data," SSL certificate verify ok.");
      }
      else {
        if ((cVar1 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          bVar6 = (conn->proxy_ssl_config).field_0x68;
        }
        else {
          bVar6 = (conn->ssl_config).field_0x68;
        }
        if ((bVar6 & 1) == 0) {
          pcVar18 = X509_verify_cert_error_string(lVar16);
          CVar45 = CURLE_OK;
          Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar18,
                     lVar16);
        }
        else {
          CVar45 = CURLE_PEER_FAILED_VERIFICATION;
          if ((char)local_9c0 != '\0') {
            pcVar18 = X509_verify_cert_error_string(lVar16);
            Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar18,lVar16);
          }
        }
      }
    }
    else {
      CVar45 = CURLE_PEER_FAILED_VERIFICATION;
      if ((char)local_9c0 != '\0') {
        Curl_failf(data,"SSL: couldn\'t get X509-issuer name!");
      }
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar6 = (conn->proxy_ssl_config).field_0x68;
    }
    else {
      bVar6 = (conn->ssl_config).field_0x68;
    }
    if ((bVar6 & 4) != 0) {
      psVar21 = conn->ssl[lVar14].backend;
      lVar16 = SSL_ctrl((SSL *)psVar21->handle,0x46,0,&ssl_sessionid);
      if (ssl_sessionid == (void *)0x0) {
        pcVar18 = "No OCSP response received";
LAB_00154250:
        bs = (OCSP_BASICRESP *)0x0;
        Curl_failf(data,pcVar18);
        resp = (OCSP_RESPONSE *)0x0;
LAB_00154265:
        CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
        bVar53 = false;
      }
      else {
        ptr = (char *)ssl_sessionid;
        resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&ptr,lVar16);
        if (resp == (OCSP_RESPONSE *)0x0) {
          pcVar18 = "Invalid OCSP response";
          goto LAB_00154250;
        }
        uVar10 = OCSP_response_status(resp);
        if (uVar10 != 0) {
          pcVar18 = OCSP_response_status_str((long)(int)uVar10);
          bs = (OCSP_BASICRESP *)0x0;
          Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar18,(ulong)uVar10);
          goto LAB_00154265;
        }
        bs = OCSP_response_get1_basic(resp);
        if (bs == (OCSP_BASICRESP *)0x0) {
          bs = (OCSP_BASICRESP *)0x0;
          Curl_failf(data,"Invalid OCSP response");
          goto LAB_00154265;
        }
        psVar26 = SSL_get_peer_cert_chain((SSL *)psVar21->handle);
        pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar21->ctx);
        iVar9 = OCSP_basic_verify(bs,psVar26,pXVar39,0);
        if (iVar9 < 1) {
          pcVar18 = "OCSP response verification failed";
LAB_00154c30:
          Curl_failf(data,pcVar18);
LAB_00154c3e:
          bVar53 = false;
          CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          local_9e0 = (X509 *)SSL_get1_peer_certificate(psVar21->handle);
          if (local_9e0 == (X509 *)0x0) {
            pcVar18 = "Error getting peer certificate";
            goto LAB_00154c30;
          }
          iVar9 = OPENSSL_sk_num(psVar26);
          iVar12 = 0;
          if (iVar9 < 1) {
            local_9c8 = (X509 *)0x0;
          }
          else {
            local_9c8 = (X509 *)0x0;
            do {
              pXVar27 = (X509 *)OPENSSL_sk_value(psVar26,iVar12);
              iVar9 = X509_check_issued(pXVar27,local_9e0);
              if (iVar9 == 0) {
                dgst = EVP_sha1();
                local_9c8 = (X509 *)OCSP_cert_to_id(dgst,local_9e0,pXVar27);
                break;
              }
              iVar12 = iVar12 + 1;
              iVar9 = OPENSSL_sk_num(psVar26);
            } while (iVar12 < iVar9);
          }
          X509_free(local_9e0);
          pXVar27 = local_9c8;
          if (local_9c8 == (X509 *)0x0) {
            pcVar18 = "Error computing OCSP ID";
            goto LAB_00154c30;
          }
          iVar9 = OCSP_resp_find_status
                            (bs,(OCSP_CERTID *)local_9c8,&cert_status,&crl_reason,
                             (ASN1_GENERALIZEDTIME **)&psig,(ASN1_GENERALIZEDTIME **)&sigalg,
                             (ASN1_GENERALIZEDTIME **)&pubkeyoid);
          OCSP_CERTID_free((OCSP_CERTID *)pXVar27);
          if (iVar9 == 1) {
            iVar9 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)sigalg,
                                        (ASN1_GENERALIZEDTIME *)pubkeyoid,300,-1);
            if (iVar9 == 0) {
              pcVar18 = "OCSP response has expired";
              goto LAB_00154c59;
            }
            pcVar18 = OCSP_cert_status_str((long)cert_status);
            Curl_infof(data,"SSL certificate status: %s (%d)",pcVar18,(ulong)(uint)cert_status);
            if (cert_status == 0) {
              bVar53 = true;
              CVar8 = CURLE_OK;
              goto LAB_0015426d;
            }
            if (cert_status != 1) goto LAB_00154265;
            pcVar18 = OCSP_crl_reason_str((long)crl_reason);
            Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar18,
                       (ulong)(uint)crl_reason);
            goto LAB_00154c3e;
          }
          pcVar18 = "Could not find certificate ID in OCSP response";
LAB_00154c59:
          bVar53 = false;
          Curl_failf(data,pcVar18);
          CVar8 = CURLE_SSL_INVALIDCERTSTATUS;
        }
      }
LAB_0015426d:
      if (bs != (OCSP_BASICRESP *)0x0) {
        OCSP_BASICRESP_free(bs);
      }
      OCSP_RESPONSE_free(resp);
      psVar21 = local_9d8;
      CVar45 = CURLE_OK;
      if (!bVar53) {
        X509_free((X509 *)local_9d8->server_cert);
        psVar21->server_cert = (X509 *)0x0;
        goto LAB_00154500;
      }
    }
    CVar8 = CURLE_OK;
    if ((char)local_9c0 != '\0') {
      CVar8 = CVar45;
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar16 = 0x8b8, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar16 = 0x8b0;
    }
    pcVar18 = *(char **)((long)&data->magic + lVar16);
    psVar21 = local_9d8;
    local_940 = pcVar18;
    if (pcVar18 != (char *)0x0 && CVar8 == CURLE_OK) {
      pXVar35 = local_9d8->server_cert;
      ssl_sessionid = (void *)0x0;
      if (pXVar35 == (X509 *)0x0) {
        CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
      }
      else {
        pXVar32 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar35);
        uVar10 = i2d_X509_PUBKEY(pXVar32,(uchar **)0x0);
        CVar8 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        puVar38 = (uchar *)0x0;
        if (0 < (int)uVar10) {
          uVar20 = (ulong)uVar10;
          puVar38 = (uchar *)(*Curl_cmalloc)(uVar20);
          ssl_sessionid = puVar38;
          if (puVar38 == (uchar *)0x0) {
            puVar38 = (uchar *)0x0;
          }
          else {
            pXVar32 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar35);
            uVar11 = i2d_X509_PUBKEY(pXVar32,(uchar **)&ssl_sessionid);
            if ((ssl_sessionid != (void *)0x0 && uVar10 == uVar11) &&
                (long)ssl_sessionid - (long)puVar38 == uVar20) {
              CVar8 = Curl_pin_peer_pubkey(data,pcVar18,puVar38,uVar20);
            }
          }
        }
        psVar21 = local_9d8;
        if (puVar38 != (uchar *)0x0) {
          (*Curl_cfree)(puVar38);
        }
      }
      if (CVar8 == CURLE_OK) {
        CVar8 = CURLE_OK;
      }
      else {
        Curl_failf(data,"SSL: public key does not match pinned public key!");
      }
    }
    X509_free((X509 *)psVar21->server_cert);
    psVar21->server_cert = (X509 *)0x0;
    conn->ssl[lVar14].connecting_state = ssl_connect_done;
  }
LAB_00154500:
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  conn->ssl[lVar14].connecting_state = ssl_connect_done;
LAB_00154511:
  bVar53 = conn->ssl[lVar14].connecting_state == ssl_connect_done;
  if (bVar53) {
    conn->ssl[lVar14].state = ssl_connection_complete;
    conn->recv[local_950] = ossl_recv;
    conn->send[local_950] = ossl_send;
  }
  *local_948 = bVar53;
  conn->ssl[lVar14].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}